

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_Open_Test::
~TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_Open_Test
          (TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_Open_Test *this)

{
  TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_Open_Test *mem;
  TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_Open_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_Open_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, TerminalOrHonorInEachSet_Open)
{
	addPair(Tile::WhiteDragon);
	addTriplet(Tile::WestWind, true);
	addTriplet(Tile::OneOfCharacters, false);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::SevenOfBamboos, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::TerminalOrHonorInEachSet));
	CHECK_EQUAL(1, r.doubling_factor);
}